

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O2

int __thiscall
ncnn::LSTM_x86::forward_int8
          (LSTM_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  pointer pMVar39;
  size_t sVar40;
  void *in_R8;
  int iVar41;
  int local_45c;
  Mat local_458;
  Mat local_408;
  ulong local_3c0;
  Mat m_7;
  Mat m_3;
  Mat local_318;
  Mat m_6;
  Option opt_quant;
  Mat m_5;
  Mat m_4;
  Mat m_2;
  Mat m_1;
  Mat m_11;
  Mat m_10;
  Mat local_78;
  undefined4 uVar5;
  undefined3 uVar7;
  undefined2 uVar9;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined3 uVar29;
  undefined2 uVar31;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_3c0 = (ulong)(uint)bottom_blob->h;
  iVar1 = (this->super_LSTM).direction;
  local_408.cstep = 0;
  local_408.data = (void *)0x0;
  local_408.refcount._0_4_ = 0;
  local_408.refcount._4_4_ = 0;
  local_408.elemsize._0_4_ = 0;
  local_408.elemsize._4_4_ = 0;
  local_408.elempack = 0;
  local_408.allocator = (Allocator *)0x0;
  local_408.dims = 0;
  local_408.w = 0;
  local_408.h = 0;
  local_408.d = 0;
  local_408.c = 0;
  local_458.cstep = 0;
  local_458.data = (void *)0x0;
  local_458.refcount._0_4_ = 0;
  local_458.refcount._4_4_ = 0;
  local_458.elemsize._0_4_ = 0;
  local_458.elemsize._4_4_ = 0;
  local_458.elempack = 0;
  local_458.allocator = (Allocator *)0x0;
  local_458.dims = 0;
  local_458.w = 0;
  local_458.h = 0;
  local_458.d = 0;
  local_458.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  local_45c = -100;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&local_318,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_408.allocator == (Allocator *)0x0) {
          free(local_408.data);
        }
        else {
          (*(local_408.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    local_408.data = local_318.data;
    local_408.refcount._0_4_ = local_318.refcount._0_4_;
    local_408.refcount._4_4_ = local_318.refcount._4_4_;
    local_408.elemsize._0_4_ = (undefined4)local_318.elemsize;
    local_408.elemsize._4_4_ = local_318.elemsize._4_4_;
    local_408.elempack = local_318.elempack;
    local_408.allocator = local_318.allocator;
    local_408.dims = local_318.dims;
    local_408.w = local_318.w;
    local_408.h = local_318.h;
    uVar33._0_4_ = local_318.d;
    uVar33._4_4_ = local_318.c;
    local_408.d = local_318.d;
    local_408.c = local_318.c;
    local_408.cstep = local_318.cstep;
    sVar40 = local_318.cstep;
    uVar34 = uVar33;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      uVar34 = local_408._52_8_;
      if (*piVar2 == 0) {
        local_408._52_8_ = uVar33;
        if (local_318.allocator == (Allocator *)0x0) {
          free(local_318.data);
          uVar34 = local_408._52_8_;
        }
        else {
          (*(local_318.allocator)->_vptr_Allocator[3])();
          uVar34 = local_408._52_8_;
        }
      }
    }
    local_408._52_8_ = uVar34;
    Mat::clone(&local_318,
               (__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar40,in_R8);
    piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_458.allocator == (Allocator *)0x0) {
          free(local_458.data);
        }
        else {
          (*(local_458.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    local_458.data = local_318.data;
    local_458.refcount._0_4_ = local_318.refcount._0_4_;
    local_458.refcount._4_4_ = local_318.refcount._4_4_;
    local_458.elemsize._0_4_ = (undefined4)local_318.elemsize;
    local_458.elemsize._4_4_ = local_318.elemsize._4_4_;
    local_458.elempack = local_318.elempack;
    local_458.allocator = local_318.allocator;
    local_458.dims = local_318.dims;
    local_458.w = local_318.w;
    local_458.h = local_318.h;
    local_458.d = local_318.d;
    local_458.c = local_318.c;
    local_458.cstep = local_318.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_318.allocator == (Allocator *)0x0) {
          free(local_318.data);
        }
        else {
          (*(local_318.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    iVar41 = (iVar1 == 2) + 1;
    Mat::create(&local_408,(this->super_LSTM).num_output,iVar41,4,_allocator);
    if ((local_408.data == (void *)0x0) || (local_408.cstep * (long)local_408.c == 0))
    goto LAB_0032d9b1;
    uVar35 = (int)local_408.cstep * local_408.c;
    uVar37 = 0;
    uVar36 = (ulong)uVar35;
    if ((int)uVar35 < 1) {
      uVar36 = uVar37;
    }
    for (; (int)uVar36 != (int)uVar37; uVar37 = uVar37 + 1) {
      *(undefined4 *)((long)local_408.data + uVar37 * 4) = 0;
    }
    Mat::create(&local_458,(this->super_LSTM).hidden_size,iVar41,4,_allocator);
    if ((local_458.data == (void *)0x0) || (local_458.cstep * (long)local_458.c == 0))
    goto LAB_0032d9b1;
    iVar41 = (int)local_458.cstep * local_458.c;
    lVar38 = 0;
    if (iVar41 < 1) {
      iVar41 = 0;
    }
    for (; iVar41 != (int)lVar38; lVar38 = lVar38 + 1) {
      *(undefined4 *)((long)local_458.data + lVar38 * 4) = 0;
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,(this->super_LSTM).num_output << (iVar1 == 2),(int)local_3c0,4,
              opt->blob_allocator);
  local_45c = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_318.cstep = 0;
    local_318.data = (void *)0x0;
    local_318.refcount._0_4_ = 0;
    local_318.refcount._4_4_ = 0;
    local_318.elemsize._0_4_ = 0;
    local_318.elemsize._4_4_ = 0;
    local_318.elempack = 0;
    local_318.allocator = (Allocator *)0x0;
    local_318.dims = 0;
    local_318.w = 0;
    local_318.h = 0;
    local_318.d = 0;
    local_318.c = 0;
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    opt_quant.lightmode = opt->lightmode;
    opt_quant.use_shader_pack8 = opt->use_shader_pack8;
    opt_quant.use_subgroup_ops = opt->use_subgroup_ops;
    opt_quant.use_reserved_0 = opt->use_reserved_0;
    opt_quant.num_threads = opt->num_threads;
    uVar3 = opt->openmp_blocktime;
    uVar4 = opt->use_winograd_convolution;
    uVar6 = opt->use_sgemm_convolution;
    uVar8 = opt->use_int8_inference;
    uVar10 = opt->use_vulkan_compute;
    uVar9 = CONCAT11(uVar10,uVar8);
    uVar7 = CONCAT21(uVar9,uVar6);
    uVar5 = CONCAT31(uVar7,uVar4);
    uVar36._0_1_ = opt->use_bf16_storage;
    uVar36._1_1_ = opt->use_fp16_packed;
    uVar36._2_1_ = opt->use_fp16_storage;
    uVar36._3_1_ = opt->use_fp16_arithmetic;
    uVar36._4_1_ = opt->use_int8_packed;
    uVar36._5_1_ = opt->use_int8_storage;
    uVar36._6_1_ = opt->use_int8_arithmetic;
    uVar36._7_1_ = opt->use_packing_layout;
    uVar11 = opt->vulkan_device_index;
    uVar12 = opt->use_reserved_1;
    uVar14 = opt->use_image_storage;
    uVar16 = opt->use_tensor_storage;
    uVar18 = opt->use_reserved_2;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar13 = CONCAT31(uVar15,uVar12);
    uVar19 = opt->flush_denormals;
    uVar20 = opt->use_local_pool_allocator;
    uVar22 = opt->use_shader_local_memory;
    uVar24 = opt->use_cooperative_matrix;
    uVar26 = opt->use_winograd23_convolution;
    uVar25 = CONCAT11(uVar26,uVar24);
    uVar23 = CONCAT21(uVar25,uVar22);
    uVar21 = CONCAT31(uVar23,uVar20);
    uVar34._0_1_ = opt->use_winograd43_convolution;
    uVar34._1_1_ = opt->use_winograd63_convolution;
    uVar34._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar34._3_1_ = opt->use_fp16_uniform;
    uVar27 = opt->use_int8_uniform;
    uVar28 = opt->use_reserved_9;
    uVar30 = opt->use_reserved_10;
    uVar32 = opt->use_reserved_11;
    uVar31 = CONCAT11(uVar32,uVar30);
    uVar29 = CONCAT21(uVar31,uVar28);
    uVar34._4_4_ = CONCAT31(uVar29,uVar27);
    opt_quant._56_4_ = SUB84(uVar34,0);
    opt_quant.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant._32_8_ = uVar36 & 0xffffffffffffff;
    opt_quant.openmp_blocktime = uVar3;
    opt_quant._28_4_ = uVar5;
    opt_quant.vulkan_device_index = uVar11;
    opt_quant._44_4_ = uVar13;
    opt_quant.flush_denormals = uVar19;
    opt_quant._52_4_ = uVar21;
    opt_quant._60_4_ = uVar34._4_4_;
    lstm_dynamic_quantize(bottom_blob,&local_318,&local_78,&opt_quant);
    uVar35 = (this->super_LSTM).direction;
    if (uVar35 < 2) {
      opt_quant._44_4_ = (this->weight_data_tm).w;
      opt_quant.flush_denormals = (this->weight_data_tm).h;
      opt_quant._56_4_ = (this->weight_data_tm).d;
      opt_quant._0_8_ = (this->weight_data_tm).data;
      sVar40 = (this->weight_data_tm).elemsize;
      opt_quant.openmp_blocktime = (this->weight_data_tm).elempack;
      opt_quant._32_8_ = (this->weight_data_tm).allocator;
      opt_quant.blob_allocator._0_4_ = 0;
      opt_quant.blob_allocator._4_4_ = 0;
      opt_quant.workspace_allocator._0_4_ = (undefined4)sVar40;
      opt_quant.workspace_allocator._4_4_ = (undefined4)(sVar40 >> 0x20);
      opt_quant.use_local_pool_allocator = true;
      opt_quant.use_shader_local_memory = false;
      opt_quant.use_cooperative_matrix = false;
      opt_quant.use_winograd23_convolution = false;
      opt_quant.vulkan_device_index = (this->weight_data_tm).dims + -1;
      m_1.w = (this->weight_data_tm_int8_descales).w;
      m_1.h = (this->weight_data_tm_int8_descales).h;
      m_1.data = (this->weight_data_tm_int8_descales).data;
      uVar36 = (this->weight_data_tm_int8_descales).elemsize;
      m_1.elempack = (this->weight_data_tm_int8_descales).elempack;
      m_1.allocator = (this->weight_data_tm_int8_descales).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar36;
      m_1.elemsize._4_4_ = (undefined4)(uVar36 >> 0x20);
      m_1.c = (this->weight_data_tm_int8_descales).d;
      m_1.d = 1;
      iVar1 = (this->weight_data_tm_int8_descales).dims;
      m_1.dims = iVar1 + -1;
      m_1.cstep = (uVar36 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar36;
      if (iVar1 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->bias_c_data_packed).w;
      m_2.h = (this->bias_c_data_packed).h;
      m_2.c = (this->bias_c_data_packed).d;
      m_2.data = (this->bias_c_data_packed).data;
      m_2.elemsize = (this->bias_c_data_packed).elemsize;
      m_2.elempack = (this->bias_c_data_packed).elempack;
      m_2.allocator = (this->bias_c_data_packed).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar40 = (long)m_2.h * (long)m_2.w;
      iVar1 = (this->bias_c_data_packed).dims;
      m_2.dims = iVar1 + -1;
      m_2.cstep = (m_2.elemsize * sVar40 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar1 == 4) {
        m_2.cstep = sVar40;
      }
      if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->super_LSTM).weight_hr_data.w;
        m_3.h = (this->super_LSTM).weight_hr_data.h;
        m_3.c = (this->super_LSTM).weight_hr_data.d;
        m_3.data = (this->super_LSTM).weight_hr_data.data;
        uVar36 = (this->super_LSTM).weight_hr_data.elemsize;
        m_3.elempack = (this->super_LSTM).weight_hr_data.elempack;
        m_3.allocator = (this->super_LSTM).weight_hr_data.allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar36;
        m_3.elemsize._4_4_ = (undefined4)(uVar36 >> 0x20);
        m_3.d = 1;
        iVar1 = (this->super_LSTM).weight_hr_data.dims;
        m_3.dims = iVar1 + -1;
        m_3.cstep = (uVar36 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar36;
        if (iVar1 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      lstm_int8(&local_318,&local_78,this_00,uVar35,(Mat *)&opt_quant,&m_1,&m_2,&m_3,&local_408,
                &local_458,opt);
      piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_3.allocator == (Allocator *)0x0) {
            free(m_3.data);
          }
          else {
            (*(m_3.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (m_2.refcount != (int *)0x0) {
        LOCK();
        *m_2.refcount = *m_2.refcount + -1;
        UNLOCK();
        if (*m_2.refcount == 0) {
          if (m_2.allocator == (Allocator *)0x0) {
            free(m_2.data);
          }
          else {
            (*(m_2.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (opt_quant._32_8_ == 0) {
            free((void *)opt_quant._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
          }
        }
      }
      uVar35 = (this->super_LSTM).direction;
    }
    if (uVar35 == 2) {
      opt_quant.lightmode = false;
      opt_quant.use_shader_pack8 = false;
      opt_quant.use_subgroup_ops = false;
      opt_quant.use_reserved_0 = false;
      opt_quant.num_threads = 0;
      opt_quant.blob_allocator._0_4_ = 0;
      opt_quant.blob_allocator._4_4_ = 0;
      opt_quant.workspace_allocator._0_4_ = 0;
      opt_quant.workspace_allocator._4_4_ = 0;
      opt_quant.openmp_blocktime = 0;
      opt_quant.use_bf16_storage = false;
      opt_quant.use_fp16_packed = false;
      opt_quant.use_fp16_storage = false;
      opt_quant.use_fp16_arithmetic = false;
      opt_quant.use_int8_packed = false;
      opt_quant.use_int8_storage = false;
      opt_quant.use_int8_arithmetic = false;
      opt_quant.use_packing_layout = false;
      opt_quant.vulkan_device_index = 0;
      opt_quant.use_reserved_1 = false;
      opt_quant.use_image_storage = false;
      opt_quant.use_tensor_storage = false;
      opt_quant.use_reserved_2 = false;
      opt_quant.flush_denormals = 0;
      opt_quant.use_local_pool_allocator = false;
      opt_quant.use_shader_local_memory = false;
      opt_quant.use_cooperative_matrix = false;
      opt_quant.use_winograd23_convolution = false;
      opt_quant.use_winograd43_convolution = false;
      opt_quant.use_winograd63_convolution = false;
      opt_quant.use_a53_a55_optimized_kernel = false;
      opt_quant.use_fp16_uniform = false;
      Mat::create((Mat *)&opt_quant,(this->super_LSTM).num_output,(int)local_3c0,4,
                  opt->workspace_allocator);
      piVar2 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (opt_quant._32_8_ == 0) {
            free((void *)opt_quant._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
          }
        }
      }
      local_45c = -100;
    }
    else {
      pMVar39 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_45c = 0;
      if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar39 == 0xd8) {
        if (pMVar39 + 1 != &local_408) {
          piVar2 = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = pMVar39[1].refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (pMVar39[1].allocator == (Allocator *)0x0) {
                free(pMVar39[1].data);
              }
              else {
                (*(pMVar39[1].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar39[1].data = local_408.data;
          pMVar39[1].refcount = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
          pMVar39[1].elemsize = CONCAT44(local_408.elemsize._4_4_,(undefined4)local_408.elemsize);
          pMVar39[1].elempack = local_408.elempack;
          pMVar39[1].allocator = local_408.allocator;
          pMVar39[1].dims = local_408.dims;
          pMVar39[1].w = local_408.w;
          pMVar39[1].h = local_408.h;
          pMVar39[1].d = local_408.d;
          pMVar39[1].c = local_408.c;
          pMVar39[1].cstep = local_408.cstep;
          pMVar39 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        if (pMVar39 + 2 != &local_458) {
          piVar2 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = pMVar39[2].refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (pMVar39[2].allocator == (Allocator *)0x0) {
                free(pMVar39[2].data);
              }
              else {
                (*(pMVar39[2].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar39[2].data = local_458.data;
          pMVar39[2].refcount = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
          pMVar39[2].elemsize = CONCAT44(local_458.elemsize._4_4_,(undefined4)local_458.elemsize);
          pMVar39[2].elempack = local_458.elempack;
          pMVar39[2].allocator = local_458.allocator;
          pMVar39[2].dims = local_458.dims;
          pMVar39[2].w = local_458.w;
          pMVar39[2].h = local_458.h;
          pMVar39[2].d = local_458.d;
          pMVar39[2].c = local_458.c;
          pMVar39[2].cstep = local_458.cstep;
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_318.allocator == (Allocator *)0x0) {
          free(local_318.data);
        }
        else {
          (*(local_318.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_0032d9b1:
  piVar2 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_458.allocator == (Allocator *)0x0) {
        free(local_458.data);
      }
      else {
        (*(local_458.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_408.allocator == (Allocator *)0x0) {
        free(local_408.data);
      }
      else {
        (*(local_408.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_45c;
}

Assistant:

int LSTM_x86::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];

    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8;
    Mat bottom_blob_int8_descales;
    {
        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        lstm_dynamic_quantize(bottom_blob, bottom_blob_int8, bottom_blob_int8_descales, opt_quant);
    }

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob, direction, weight_data_tm.channel(0), weight_data_tm_int8_descales.channel(0), bias_c_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        {
            lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob_forward, 0, weight_data_tm.channel(0), weight_data_tm_int8_descales.channel(0), bias_c_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
        }

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        {
            lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob_reverse, 1, weight_data_tm.channel(1), weight_data_tm_int8_descales.channel(1), bias_c_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}